

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void idx2::CallocBuf(buffer *Buf,i64 Bytes,allocator *Alloc)

{
  allocator *paVar1;
  byte *pbVar2;
  undefined1 local_38 [8];
  printer Pr;
  allocator *Alloc_local;
  i64 Bytes_local;
  buffer *Buf_local;
  
  Pr.File = (FILE *)Alloc;
  paVar1 = &Mallocator()->super_allocator;
  if (Alloc == paVar1) {
    pbVar2 = (byte *)calloc(Bytes,1);
    Buf->Data = pbVar2;
  }
  else {
    AllocBuf(Buf,Bytes,(allocator *)Pr.File);
    ZeroBuf(Buf);
  }
  if (Buf->Data == (byte *)0x0) {
    fprintf(_stderr,"Condition \"%s\" failed, ","!(!(Buf->Data)) && \"Fatal error!\"");
    fprintf(_stderr,"in file %s, line %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.cpp"
            ,0x59);
    fprintf(_stderr,"Out of memory");
    fprintf(_stderr,"\n");
    printer::printer((printer *)local_38,(FILE *)_stderr);
    PrintStacktrace((printer *)local_38);
    exit(1);
  }
  Buf->Bytes = Bytes;
  Buf->Alloc = (allocator *)Pr.File;
  return;
}

Assistant:

void
CallocBuf(buffer* Buf, i64 Bytes, allocator* Alloc)
{
  idx2_Assert(!Buf->Data || Buf->Bytes == 0, "Buffer not freed before allocating new memory");
  if (Alloc == &Mallocator())
  {
    Buf->Data = (byte*)calloc(size_t(Bytes), 1);
  }
  else
  {
    AllocBuf(Buf, Bytes, Alloc);
    ZeroBuf(Buf);
  }
  idx2_AbortIf(!(Buf->Data), "Out of memory");
  Buf->Bytes = Bytes;
  Buf->Alloc = Alloc;
}